

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O0

void msd_A2(uchar **strings,size_t N)

{
  cacheblock_t *cache_00;
  ulong local_48;
  size_t i_1;
  TempSpace tmp;
  size_t i;
  cacheblock_t *cache;
  size_t N_local;
  uchar **strings_local;
  
  cache_00 = (cacheblock_t *)malloc(N << 4);
  for (tmp.elements_in_strings = 0; tmp.elements_in_strings < N;
      tmp.elements_in_strings = tmp.elements_in_strings + 1) {
    cache_00[tmp.elements_in_strings].ptr = strings[tmp.elements_in_strings];
  }
  TempSpace::TempSpace((TempSpace *)&i_1,strings,N);
  fill_cache(cache_00,N,0);
  msd_A2(cache_00,N,0,0,(TempSpace *)&i_1);
  for (local_48 = 0; local_48 < N; local_48 = local_48 + 1) {
    strings[local_48] = cache_00[local_48].ptr;
  }
  free(cache_00);
  return;
}

Assistant:

void
msd_A2(unsigned char** strings, size_t N)
{
	cacheblock_t* cache =
		static_cast<cacheblock_t*>(malloc(N*sizeof(cacheblock_t)));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	TempSpace tmp(strings, N);
	fill_cache(cache, N, 0);
	msd_A2(cache, N, 0, 0, tmp);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}